

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::ShaderBuiltinConstantCase::~ShaderBuiltinConstantCase
          (ShaderBuiltinConstantCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderBuiltinConstantCase_00772d70;
  pcVar2 = (this->m_varName)._M_dataplus._M_p;
  paVar1 = &(this->m_varName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  deqp::gls::ShaderRenderCase::~ShaderRenderCase(&this->super_ShaderRenderCase);
  return;
}

Assistant:

ShaderBuiltinConstantCase::~ShaderBuiltinConstantCase (void)
{
}